

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex.cpp
# Opt level: O1

string_t __thiscall
duckdb::BinaryUhugeIntOperator::Operation<duckdb::uhugeint_t,duckdb::string_t>
          (BinaryUhugeIntOperator *this,uhugeint_t input,Vector *result)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  int iVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  undefined *len;
  byte *pbVar13;
  uint64_t lower;
  uint64_t upper;
  Vector *vector;
  undefined1 *puVar14;
  long lVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 *puVar24;
  long lVar25;
  undefined1 *puVar26;
  long lVar27;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var28;
  long lVar29;
  undefined1 *puVar30;
  long lVar31;
  undefined1 *puVar32;
  long lVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  ulong uVar36;
  int iVar39;
  undefined1 auVar37 [16];
  int iVar40;
  undefined1 auVar38 [16];
  int iVar41;
  int iVar53;
  int iVar54;
  int iVar55;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 in_XMM10 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  int iVar66;
  undefined1 auVar65 [16];
  int iVar67;
  undefined1 *puVar68;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 *puVar76;
  long lVar77;
  hugeint_t hVar78;
  string_t target;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 *local_48;
  long lStack_40;
  uhugeint_t local_30;
  
  local_30.lower = (uint64_t)this;
  local_30.upper = input.lower;
  hVar78 = uhugeint_t::operator_cast_to_hugeint_t(&local_30);
  uVar11 = hVar78.lower;
  if (hVar78.upper == 0) {
    if (uVar11 == 0) {
      lVar12 = 0x80;
      len = (undefined *)0x0;
      goto LAB_01b5e6f8;
    }
    lVar12 = 0x7f;
  }
  else {
    lVar12 = 0x3f;
    uVar11 = hVar78.upper;
  }
  uVar11 = uVar11 >> 1 | uVar11;
  uVar11 = uVar11 >> 2 | uVar11;
  uVar11 = uVar11 >> 4 | uVar11;
  uVar11 = uVar11 >> 8 | uVar11;
  uVar11 = uVar11 >> 0x10 | uVar11;
  len = &DAT_01e5e0f0;
  lVar12 = lVar12 - *(long *)(&DAT_01e5e0f0 +
                             ((uVar11 >> 0x20 | uVar11) * 0x3f79d71b4cb0a89 >> 0x3a) * 8);
LAB_01b5e6f8:
  if (lVar12 == 0x80) {
    local_68 = (undefined1  [16])
               StringVector::EmptyString
                         ((StringVector *)input.upper,(Vector *)&DAT_00000001,(idx_t)len);
    uVar10 = local_68._0_4_;
    puVar68 = local_68._8_8_;
    if (uVar10 < 0xd) {
      puVar68 = local_68 + 4;
    }
    *puVar68 = 0x30;
  }
  else {
    vector = (Vector *)(0x80 - lVar12);
    local_68 = (undefined1  [16])
               StringVector::EmptyString((StringVector *)input.upper,vector,(idx_t)len);
    uVar10 = local_68._0_4_;
    pbVar13 = local_68._8_8_;
    if (uVar10 < 0xd) {
      pbVar13 = local_68 + 4;
    }
    if ((Vector *)0x40 < vector) {
      do {
        *pbVar13 = (input.lower >> ((ulong)((int)vector - 1U & 0xff) & 0x3f) & 1) != 0 | 0x30;
        pbVar13 = pbVar13 + 1;
        vector = (Vector *)
                 ((long)&vector[-1].auxiliary.internal.
                         super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi + 7);
      } while ((Vector *)0x40 < vector);
      vector = (Vector *)0x40;
    }
    if (vector != (Vector *)0x0) {
      iVar9 = (int)vector;
      puVar14 = (undefined1 *)
                ((long)&vector[-1].auxiliary.internal.
                        super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi + 7);
      auVar34._8_4_ = iVar9;
      auVar34._0_8_ = vector;
      auVar34._12_4_ = (int)((ulong)vector >> 0x20);
      puVar68 = (undefined1 *)
                ((long)&vector[-1].auxiliary.internal.
                        super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                + 2);
      lVar15 = auVar34._8_8_;
      lVar12 = lVar15 + -0xf;
      puVar24 = (undefined1 *)
                ((long)&vector[-1].auxiliary.internal.
                        super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                + 4);
      lVar25 = lVar15 + -0xd;
      puVar26 = (undefined1 *)
                ((long)&vector[-1].auxiliary.internal.
                        super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                + 6);
      lVar27 = lVar15 + -0xb;
      p_Var28 = &vector[-1].auxiliary.internal.
                 super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      lVar29 = lVar15 + -9;
      puVar30 = (undefined1 *)
                ((long)&vector[-1].auxiliary.internal.
                        super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi + 2);
      lVar31 = lVar15 + -7;
      puVar32 = (undefined1 *)
                ((long)&vector[-1].auxiliary.internal.
                        super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi + 4);
      lVar33 = lVar15 + -5;
      puVar76 = (undefined1 *)
                ((long)&vector[-1].auxiliary.internal.
                        super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi + 6);
      lVar77 = lVar15 + -3;
      lVar15 = lVar15 + -1;
      local_58._8_4_ = (int)puVar14;
      local_58._0_8_ = puVar14;
      local_58._12_4_ = (int)((ulong)puVar14 >> 0x20);
      uVar11 = 0;
      do {
        auVar65._8_4_ = (int)uVar11;
        auVar65._0_8_ = uVar11;
        auVar65._12_4_ = (int)(uVar11 >> 0x20);
        auVar37 = local_58 ^ _DAT_01de8e80;
        auVar34 = (auVar65 | _DAT_01df1070) ^ _DAT_01de8e80;
        iVar66 = auVar37._0_4_;
        iVar41 = -(uint)(iVar66 < auVar34._0_4_);
        iVar67 = auVar37._4_4_;
        iVar53 = -(uint)(iVar67 < auVar34._4_4_);
        iVar39 = auVar37._8_4_;
        iVar54 = -(uint)(iVar39 < auVar34._8_4_);
        iVar40 = auVar37._12_4_;
        iVar55 = -(uint)(iVar40 < auVar34._12_4_);
        auVar69._4_4_ = iVar41;
        auVar69._0_4_ = iVar41;
        auVar69._8_4_ = iVar54;
        auVar69._12_4_ = iVar54;
        auVar61 = pshuflw(in_XMM12,auVar69,0xe8);
        auVar43._4_4_ = -(uint)(auVar34._4_4_ == iVar67);
        auVar43._12_4_ = -(uint)(auVar34._12_4_ == iVar40);
        auVar43._0_4_ = auVar43._4_4_;
        auVar43._8_4_ = auVar43._12_4_;
        auVar56 = pshuflw(in_XMM10,auVar43,0xe8);
        auVar35._4_4_ = iVar53;
        auVar35._0_4_ = iVar53;
        auVar35._8_4_ = iVar55;
        auVar35._12_4_ = iVar55;
        auVar34 = pshuflw(_DAT_01de8e80,auVar35,0xe8);
        auVar37._8_4_ = 0xffffffff;
        auVar37._0_8_ = 0xffffffffffffffff;
        auVar37._12_4_ = 0xffffffff;
        auVar37 = (auVar34 | auVar56 & auVar61) ^ auVar37;
        auVar34 = packssdw(auVar37,auVar37);
        local_48 = puVar68;
        lStack_40 = lVar12;
        if ((auVar34 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          pbVar13[uVar11] =
               ((ulong)this >>
                ((ulong)((long)&vector[-1].auxiliary.internal.
                                super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount._M_pi + 7) & 0x3f) & 1) != 0 | 0x30;
        }
        auVar35 = auVar43 & auVar69 | auVar35;
        auVar34 = packssdw(auVar35,auVar35);
        auVar56._8_4_ = 0xffffffff;
        auVar56._0_8_ = 0xffffffffffffffff;
        auVar56._12_4_ = 0xffffffff;
        auVar34 = packssdw(auVar34 ^ auVar56,auVar34 ^ auVar56);
        auVar34 = packsswb(auVar34,auVar34);
        if ((auVar34._0_4_ >> 8 & 1) != 0) {
          pbVar13[uVar11 + 1] = ((ulong)this >> (lVar15 - 1U & 0x3f) & 1) != 0 | 0x30;
        }
        auVar34 = (auVar65 | _DAT_01df1090) ^ _DAT_01de8e80;
        iVar41 = -(uint)(iVar66 < auVar34._0_4_);
        iVar54 = -(uint)(iVar67 < auVar34._4_4_);
        iVar53 = -(uint)(iVar39 < auVar34._8_4_);
        iVar55 = -(uint)(iVar40 < auVar34._12_4_);
        auVar42._4_4_ = iVar41;
        auVar42._0_4_ = iVar41;
        auVar42._8_4_ = iVar53;
        auVar42._12_4_ = iVar53;
        iVar41 = -(uint)(auVar34._4_4_ == iVar67);
        iVar53 = -(uint)(auVar34._12_4_ == iVar40);
        auVar70._4_4_ = iVar41;
        auVar70._0_4_ = iVar41;
        auVar70._8_4_ = iVar53;
        auVar70._12_4_ = iVar53;
        auVar62._4_4_ = iVar54;
        auVar62._0_4_ = iVar54;
        auVar62._8_4_ = iVar55;
        auVar62._12_4_ = iVar55;
        auVar34 = auVar70 & auVar42 | auVar62;
        auVar34 = packssdw(auVar34,auVar34);
        auVar61._8_4_ = 0xffffffff;
        auVar61._0_8_ = 0xffffffffffffffff;
        auVar61._12_4_ = 0xffffffff;
        auVar34 = packssdw(auVar34 ^ auVar61,auVar34 ^ auVar61);
        auVar34 = packsswb(auVar34,auVar34);
        if ((auVar34._0_4_ >> 0x10 & 1) != 0) {
          pbVar13[uVar11 + 2] = ((ulong)this >> ((ulong)(puVar76 + -1) & 0x3f) & 1) != 0 | 0x30;
        }
        auVar34 = pshufhw(auVar34,auVar42,0x84);
        auVar43 = pshufhw(auVar42,auVar70,0x84);
        auVar37 = pshufhw(auVar34,auVar62,0x84);
        auVar16._8_4_ = 0xffffffff;
        auVar16._0_8_ = 0xffffffffffffffff;
        auVar16._12_4_ = 0xffffffff;
        auVar16 = (auVar37 | auVar43 & auVar34) ^ auVar16;
        auVar34 = packssdw(auVar16,auVar16);
        auVar34 = packsswb(auVar34,auVar34);
        if ((auVar34._0_4_ >> 0x18 & 1) != 0) {
          pbVar13[uVar11 + 3] = ((ulong)this >> (lVar77 - 1U & 0x3f) & 1) != 0 | 0x30;
        }
        auVar34 = (auVar65 | _DAT_01df10c0) ^ _DAT_01de8e80;
        auVar57._0_4_ = -(uint)(iVar66 < auVar34._0_4_);
        auVar57._4_4_ = -(uint)(iVar67 < auVar34._4_4_);
        auVar57._8_4_ = -(uint)(iVar39 < auVar34._8_4_);
        auVar57._12_4_ = -(uint)(iVar40 < auVar34._12_4_);
        auVar71._4_4_ = auVar57._0_4_;
        auVar71._0_4_ = auVar57._0_4_;
        auVar71._8_4_ = auVar57._8_4_;
        auVar71._12_4_ = auVar57._8_4_;
        auVar43 = pshuflw(auVar62,auVar71,0xe8);
        auVar17._0_4_ = -(uint)(auVar34._0_4_ == iVar66);
        auVar17._4_4_ = -(uint)(auVar34._4_4_ == iVar67);
        auVar17._8_4_ = -(uint)(auVar34._8_4_ == iVar39);
        auVar17._12_4_ = -(uint)(auVar34._12_4_ == iVar40);
        auVar44._4_4_ = auVar17._4_4_;
        auVar44._0_4_ = auVar17._4_4_;
        auVar44._8_4_ = auVar17._12_4_;
        auVar44._12_4_ = auVar17._12_4_;
        auVar34 = pshuflw(auVar17,auVar44,0xe8);
        auVar45._4_4_ = auVar57._4_4_;
        auVar45._0_4_ = auVar57._4_4_;
        auVar45._8_4_ = auVar57._12_4_;
        auVar45._12_4_ = auVar57._12_4_;
        auVar37 = pshuflw(auVar57,auVar45,0xe8);
        auVar1._8_4_ = 0xffffffff;
        auVar1._0_8_ = 0xffffffffffffffff;
        auVar1._12_4_ = 0xffffffff;
        auVar34 = packssdw(auVar34 & auVar43,(auVar37 | auVar34 & auVar43) ^ auVar1);
        auVar34 = packsswb(auVar34,auVar34);
        if ((auVar34 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          pbVar13[uVar11 + 4] = ((ulong)this >> ((ulong)(puVar32 + -1) & 0x3f) & 1) != 0 | 0x30;
        }
        auVar45 = auVar44 & auVar71 | auVar45;
        auVar37 = packssdw(auVar45,auVar45);
        auVar2._8_4_ = 0xffffffff;
        auVar2._0_8_ = 0xffffffffffffffff;
        auVar2._12_4_ = 0xffffffff;
        auVar34 = packssdw(auVar34,auVar37 ^ auVar2);
        auVar34 = packsswb(auVar34,auVar34);
        if ((auVar34._4_2_ >> 8 & 1) != 0) {
          pbVar13[uVar11 + 5] = ((ulong)this >> (lVar33 - 1U & 0x3f) & 1) != 0 | 0x30;
        }
        auVar34 = (auVar65 | _DAT_01df10b0) ^ _DAT_01de8e80;
        iVar41 = -(uint)(iVar66 < auVar34._0_4_);
        iVar54 = -(uint)(iVar67 < auVar34._4_4_);
        iVar53 = -(uint)(iVar39 < auVar34._8_4_);
        iVar55 = -(uint)(iVar40 < auVar34._12_4_);
        auVar46._4_4_ = iVar41;
        auVar46._0_4_ = iVar41;
        auVar46._8_4_ = iVar53;
        auVar46._12_4_ = iVar53;
        iVar41 = -(uint)(auVar34._4_4_ == iVar67);
        iVar53 = -(uint)(auVar34._12_4_ == iVar40);
        auVar63._4_4_ = iVar41;
        auVar63._0_4_ = iVar41;
        auVar63._8_4_ = iVar53;
        auVar63._12_4_ = iVar53;
        auVar72._4_4_ = iVar54;
        auVar72._0_4_ = iVar54;
        auVar72._8_4_ = iVar55;
        auVar72._12_4_ = iVar55;
        auVar34 = auVar63 & auVar46 | auVar72;
        auVar34 = packssdw(auVar34,auVar34);
        auVar3._8_4_ = 0xffffffff;
        auVar3._0_8_ = 0xffffffffffffffff;
        auVar3._12_4_ = 0xffffffff;
        auVar34 = packssdw(auVar34 ^ auVar3,auVar34 ^ auVar3);
        auVar34 = packsswb(auVar34,auVar34);
        if ((auVar34 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          pbVar13[uVar11 + 6] = ((ulong)this >> ((ulong)(puVar30 + -1) & 0x3f) & 1) != 0 | 0x30;
        }
        auVar34 = pshufhw(auVar34,auVar46,0x84);
        auVar43 = pshufhw(auVar46,auVar63,0x84);
        auVar37 = pshufhw(auVar34,auVar72,0x84);
        auVar18._8_4_ = 0xffffffff;
        auVar18._0_8_ = 0xffffffffffffffff;
        auVar18._12_4_ = 0xffffffff;
        auVar18 = (auVar37 | auVar43 & auVar34) ^ auVar18;
        auVar34 = packssdw(auVar18,auVar18);
        auVar34 = packsswb(auVar34,auVar34);
        if ((auVar34._6_2_ >> 8 & 1) != 0) {
          pbVar13[uVar11 + 7] = ((ulong)this >> (lVar31 - 1U & 0x3f) & 1) != 0 | 0x30;
        }
        auVar34 = (auVar65 | _DAT_01e11480) ^ _DAT_01de8e80;
        auVar58._0_4_ = -(uint)(iVar66 < auVar34._0_4_);
        auVar58._4_4_ = -(uint)(iVar67 < auVar34._4_4_);
        auVar58._8_4_ = -(uint)(iVar39 < auVar34._8_4_);
        auVar58._12_4_ = -(uint)(iVar40 < auVar34._12_4_);
        auVar73._4_4_ = auVar58._0_4_;
        auVar73._0_4_ = auVar58._0_4_;
        auVar73._8_4_ = auVar58._8_4_;
        auVar73._12_4_ = auVar58._8_4_;
        auVar43 = pshuflw(auVar63,auVar73,0xe8);
        auVar19._0_4_ = -(uint)(auVar34._0_4_ == iVar66);
        auVar19._4_4_ = -(uint)(auVar34._4_4_ == iVar67);
        auVar19._8_4_ = -(uint)(auVar34._8_4_ == iVar39);
        auVar19._12_4_ = -(uint)(auVar34._12_4_ == iVar40);
        auVar47._4_4_ = auVar19._4_4_;
        auVar47._0_4_ = auVar19._4_4_;
        auVar47._8_4_ = auVar19._12_4_;
        auVar47._12_4_ = auVar19._12_4_;
        auVar34 = pshuflw(auVar19,auVar47,0xe8);
        auVar48._4_4_ = auVar58._4_4_;
        auVar48._0_4_ = auVar58._4_4_;
        auVar48._8_4_ = auVar58._12_4_;
        auVar48._12_4_ = auVar58._12_4_;
        auVar37 = pshuflw(auVar58,auVar48,0xe8);
        auVar59._8_4_ = 0xffffffff;
        auVar59._0_8_ = 0xffffffffffffffff;
        auVar59._12_4_ = 0xffffffff;
        auVar59 = (auVar37 | auVar34 & auVar43) ^ auVar59;
        auVar37 = packssdw(auVar59,auVar59);
        auVar34 = packsswb(auVar34 & auVar43,auVar37);
        if ((auVar34 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          pbVar13[uVar11 + 8] =
               ((ulong)this >>
                ((ulong)((long)&((__shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2> *)
                                (p_Var28 + -1))->_M_ptr + 7) & 0x3f) & 1) != 0 | 0x30;
        }
        auVar48 = auVar47 & auVar73 | auVar48;
        auVar37 = packssdw(auVar48,auVar48);
        auVar4._8_4_ = 0xffffffff;
        auVar4._0_8_ = 0xffffffffffffffff;
        auVar4._12_4_ = 0xffffffff;
        auVar37 = packssdw(auVar37 ^ auVar4,auVar37 ^ auVar4);
        auVar34 = packsswb(auVar34,auVar37);
        if ((auVar34._8_2_ >> 8 & 1) != 0) {
          pbVar13[uVar11 + 9] = ((ulong)this >> (lVar29 - 1U & 0x3f) & 1) != 0 | 0x30;
        }
        auVar34 = (auVar65 | _DAT_01e11470) ^ _DAT_01de8e80;
        iVar41 = -(uint)(iVar66 < auVar34._0_4_);
        iVar54 = -(uint)(iVar67 < auVar34._4_4_);
        iVar53 = -(uint)(iVar39 < auVar34._8_4_);
        iVar55 = -(uint)(iVar40 < auVar34._12_4_);
        auVar49._4_4_ = iVar41;
        auVar49._0_4_ = iVar41;
        auVar49._8_4_ = iVar53;
        auVar49._12_4_ = iVar53;
        iVar41 = -(uint)(auVar34._4_4_ == iVar67);
        iVar53 = -(uint)(auVar34._12_4_ == iVar40);
        auVar64._4_4_ = iVar41;
        auVar64._0_4_ = iVar41;
        auVar64._8_4_ = iVar53;
        auVar64._12_4_ = iVar53;
        auVar74._4_4_ = iVar54;
        auVar74._0_4_ = iVar54;
        auVar74._8_4_ = iVar55;
        auVar74._12_4_ = iVar55;
        auVar34 = auVar64 & auVar49 | auVar74;
        auVar34 = packssdw(auVar34,auVar34);
        auVar5._8_4_ = 0xffffffff;
        auVar5._0_8_ = 0xffffffffffffffff;
        auVar5._12_4_ = 0xffffffff;
        auVar34 = packssdw(auVar34 ^ auVar5,auVar34 ^ auVar5);
        auVar34 = packsswb(auVar34,auVar34);
        if ((auVar34 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
          pbVar13[uVar11 + 10] = ((ulong)this >> ((ulong)(puVar26 + -1) & 0x3f) & 1) != 0 | 0x30;
        }
        auVar34 = pshufhw(auVar34,auVar49,0x84);
        auVar43 = pshufhw(auVar49,auVar64,0x84);
        auVar37 = pshufhw(auVar34,auVar74,0x84);
        auVar20._8_4_ = 0xffffffff;
        auVar20._0_8_ = 0xffffffffffffffff;
        auVar20._12_4_ = 0xffffffff;
        auVar20 = (auVar37 | auVar43 & auVar34) ^ auVar20;
        auVar34 = packssdw(auVar20,auVar20);
        auVar34 = packsswb(auVar34,auVar34);
        if ((auVar34._10_2_ >> 8 & 1) != 0) {
          pbVar13[uVar11 + 0xb] = ((ulong)this >> (lVar27 - 1U & 0x3f) & 1) != 0 | 0x30;
        }
        auVar34 = (auVar65 | _DAT_01e11460) ^ _DAT_01de8e80;
        auVar60._0_4_ = -(uint)(iVar66 < auVar34._0_4_);
        auVar60._4_4_ = -(uint)(iVar67 < auVar34._4_4_);
        auVar60._8_4_ = -(uint)(iVar39 < auVar34._8_4_);
        auVar60._12_4_ = -(uint)(iVar40 < auVar34._12_4_);
        auVar75._4_4_ = auVar60._0_4_;
        auVar75._0_4_ = auVar60._0_4_;
        auVar75._8_4_ = auVar60._8_4_;
        auVar75._12_4_ = auVar60._8_4_;
        auVar43 = pshuflw(auVar64,auVar75,0xe8);
        auVar21._0_4_ = -(uint)(auVar34._0_4_ == iVar66);
        auVar21._4_4_ = -(uint)(auVar34._4_4_ == iVar67);
        auVar21._8_4_ = -(uint)(auVar34._8_4_ == iVar39);
        auVar21._12_4_ = -(uint)(auVar34._12_4_ == iVar40);
        auVar50._4_4_ = auVar21._4_4_;
        auVar50._0_4_ = auVar21._4_4_;
        auVar50._8_4_ = auVar21._12_4_;
        auVar50._12_4_ = auVar21._12_4_;
        auVar34 = pshuflw(auVar21,auVar50,0xe8);
        auVar51._4_4_ = auVar60._4_4_;
        auVar51._0_4_ = auVar60._4_4_;
        auVar51._8_4_ = auVar60._12_4_;
        auVar51._12_4_ = auVar60._12_4_;
        auVar37 = pshuflw(auVar60,auVar51,0xe8);
        auVar6._8_4_ = 0xffffffff;
        auVar6._0_8_ = 0xffffffffffffffff;
        auVar6._12_4_ = 0xffffffff;
        auVar34 = packssdw(auVar34 & auVar43,(auVar37 | auVar34 & auVar43) ^ auVar6);
        auVar34 = packsswb(auVar34,auVar34);
        if ((auVar34 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          pbVar13[uVar11 + 0xc] = ((ulong)this >> ((ulong)(puVar24 + -1) & 0x3f) & 1) != 0 | 0x30;
        }
        auVar51 = auVar50 & auVar75 | auVar51;
        auVar37 = packssdw(auVar51,auVar51);
        auVar7._8_4_ = 0xffffffff;
        auVar7._0_8_ = 0xffffffffffffffff;
        auVar7._12_4_ = 0xffffffff;
        auVar34 = packssdw(auVar34,auVar37 ^ auVar7);
        auVar34 = packsswb(auVar34,auVar34);
        if ((auVar34._12_2_ >> 8 & 1) != 0) {
          pbVar13[uVar11 + 0xd] = ((ulong)this >> (lVar25 - 1U & 0x3f) & 1) != 0 | 0x30;
        }
        lVar12 = lStack_40;
        puVar68 = local_48;
        uVar36 = lStack_40 - 1;
        auVar34 = (auVar65 | _DAT_01e11450) ^ _DAT_01de8e80;
        auVar22._0_4_ = -(uint)(iVar66 < auVar34._0_4_);
        auVar22._4_4_ = -(uint)(iVar67 < auVar34._4_4_);
        auVar22._8_4_ = -(uint)(iVar39 < auVar34._8_4_);
        auVar22._12_4_ = -(uint)(iVar40 < auVar34._12_4_);
        auVar52._4_4_ = auVar22._0_4_;
        auVar52._0_4_ = auVar22._0_4_;
        auVar52._8_4_ = auVar22._8_4_;
        auVar52._12_4_ = auVar22._8_4_;
        iVar66 = -(uint)(auVar34._4_4_ == iVar67);
        iVar67 = -(uint)(auVar34._12_4_ == iVar40);
        auVar38._4_4_ = iVar66;
        auVar38._0_4_ = iVar66;
        auVar38._8_4_ = iVar67;
        auVar38._12_4_ = iVar67;
        in_XMM12._4_4_ = auVar22._4_4_;
        in_XMM12._0_4_ = auVar22._4_4_;
        in_XMM12._8_4_ = auVar22._12_4_;
        in_XMM12._12_4_ = auVar22._12_4_;
        in_XMM10 = auVar38 & auVar52 | in_XMM12;
        auVar34 = packssdw(auVar22,in_XMM10);
        auVar8._8_4_ = 0xffffffff;
        auVar8._0_8_ = 0xffffffffffffffff;
        auVar8._12_4_ = 0xffffffff;
        auVar34 = packssdw(auVar34 ^ auVar8,auVar34 ^ auVar8);
        auVar34 = packsswb(auVar34,auVar34);
        if ((auVar34 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          pbVar13[uVar11 + 0xe] = ((ulong)this >> ((ulong)(local_48 + -1) & 0x3f) & 1) != 0 | 0x30;
        }
        auVar34 = pshufhw(auVar34,auVar52,0x84);
        auVar43 = pshufhw(auVar38,auVar38,0x84);
        auVar37 = pshufhw(auVar34,in_XMM12,0x84);
        auVar23._8_4_ = 0xffffffff;
        auVar23._0_8_ = 0xffffffffffffffff;
        auVar23._12_4_ = 0xffffffff;
        auVar23 = (auVar37 | auVar43 & auVar34) ^ auVar23;
        auVar34 = packssdw(auVar23,auVar23);
        auVar34 = packsswb(auVar34,auVar34);
        if ((auVar34._14_2_ >> 8 & 1) != 0) {
          pbVar13[uVar11 + 0xf] = ((ulong)this >> (uVar36 & 0x3f) & 1) != 0 | 0x30;
        }
        uVar11 = uVar11 + 0x10;
        vector = (Vector *)&vector[-1].auxiliary;
        lVar15 = lVar15 + -0x10;
        puVar76 = puVar76 + -0x10;
        lVar77 = lVar77 + -0x10;
        puVar32 = puVar32 + -0x10;
        lVar33 = lVar33 + -0x10;
        puVar30 = puVar30 + -0x10;
        lVar31 = lVar31 + -0x10;
        p_Var28 = p_Var28 + -2;
        lVar29 = lVar29 + -0x10;
        puVar26 = puVar26 + -0x10;
        lVar27 = lVar27 + -0x10;
        puVar24 = puVar24 + -0x10;
        lVar25 = lVar25 + -0x10;
        puVar68 = puVar68 + -0x10;
        lVar12 = lVar12 + -0x10;
      } while ((iVar9 + 0xfU & 0xf0) != uVar11);
    }
  }
  uVar11 = (ulong)uVar10;
  if (uVar11 < 0xd) {
    switchD_0105b559::default(local_68 + uVar11 + 4,0,0xc - uVar11);
  }
  else {
    local_68._4_4_ = *(undefined4 *)local_68._8_8_;
  }
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)local_68;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, Vector &result) {
		auto num_leading_zero = CountZeros<hugeint_t>::Leading(UnsafeNumericCast<uhugeint_t>(input));
		idx_t buffer_size = sizeof(INPUT_TYPE) * 8 - num_leading_zero;

		// Special case: All bits are zero
		if (buffer_size == 0) {
			auto target = StringVector::EmptyString(result, 1);
			auto output = target.GetDataWriteable();
			*output = '0';
			target.Finalize();
			return target;
		}

		auto target = StringVector::EmptyString(result, buffer_size);
		auto output = target.GetDataWriteable();

		WriteHugeIntBinBytes<uhugeint_t>(input, output, buffer_size);

		target.Finalize();
		return target;
	}